

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O2

void __thiscall
cbt2DsegmentShape::cbt2DsegmentShape
          (cbt2DsegmentShape *this,cbtVector3 *mP1,cbtVector3 *mP2,cbtScalar mzthickness)

{
  undefined8 uVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  
  cbtConvexInternalShape::cbtConvexInternalShape(&this->super_cbtConvexInternalShape);
  (this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
  _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtConvexShape_01195118;
  cVar2 = mP1->m_floats[2];
  cVar3 = mP1->m_floats[3];
  *(undefined8 *)&(this->super_cbtConvexInternalShape).field_0x44 = *(undefined8 *)mP1->m_floats;
  *(cbtScalar *)&this->field_0x4c = cVar2;
  *(cbtScalar *)&this->field_0x50 = cVar3;
  uVar1 = *(undefined8 *)(mP2->m_floats + 2);
  *(undefined8 *)(this->P2).m_floats = *(undefined8 *)mP2->m_floats;
  *(undefined8 *)((this->P2).m_floats + 2) = uVar1;
  (this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.m_shapeType =
       0x1e;
  this->zthickness = mzthickness;
  return;
}

Assistant:

cbt2DsegmentShape::cbt2DsegmentShape(const cbtVector3& mP1, const cbtVector3& mP2, const cbtScalar mzthickness)
{
	P1 = mP1;
	P2 = mP2;
	m_shapeType = SEGMENT_SHAPE_PROXYTYPE;
    zthickness = mzthickness;
}